

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav__read_list_labelled_cue_region_to_metadata_obj
                    (ma_dr_wav__metadata_parser *pParser,ma_dr_wav_metadata *pMetadata,
                    ma_uint64 chunkSize)

{
  ma_uint16 mVar1;
  ma_uint32 mVar2;
  uint uVar3;
  ma_dr_wav__metadata_parser *pParser_00;
  ma_uint8 *pmVar4;
  int in_EDX;
  undefined4 *in_RSI;
  ma_dr_wav__metadata_parser *in_RDI;
  ma_uint32 sizeIncludingNullTerminator;
  size_t bytesJustRead;
  ma_uint64 totalBytesRead;
  ma_uint8 buffer [20];
  size_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ma_dr_wav__metadata_parser *in_stack_ffffffffffffffb8;
  ma_uint8 local_38 [4];
  ma_uint8 amStack_34 [4];
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  ma_uint8 amStack_2c [2];
  ma_uint8 amStack_2a [2];
  ma_uint8 amStack_28 [2];
  ma_uint8 amStack_26 [14];
  int local_18;
  undefined4 *local_10;
  ma_dr_wav__metadata_parser *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = in_EDX;
  pParser_00 = (ma_dr_wav__metadata_parser *)
               ma_dr_wav__metadata_parser_read
                         (in_stack_ffffffffffffffb8,
                          (void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8,(ma_uint64 *)0x217bb5);
  if (pParser_00 == (ma_dr_wav__metadata_parser *)0x14) {
    *local_10 = 0x100;
    mVar2 = ma_dr_wav_bytes_to_u32(local_38);
    local_10[2] = mVar2;
    mVar2 = ma_dr_wav_bytes_to_u32(amStack_34);
    local_10[3] = mVar2;
    *(undefined1 *)(local_10 + 4) = local_30;
    *(undefined1 *)((long)local_10 + 0x11) = local_2f;
    *(undefined1 *)((long)local_10 + 0x12) = local_2e;
    *(undefined1 *)((long)local_10 + 0x13) = local_2d;
    mVar1 = ma_dr_wav_bytes_to_u16(amStack_2c);
    *(ma_uint16 *)(local_10 + 5) = mVar1;
    mVar1 = ma_dr_wav_bytes_to_u16(amStack_2a);
    *(ma_uint16 *)((long)local_10 + 0x16) = mVar1;
    mVar1 = ma_dr_wav_bytes_to_u16(amStack_28);
    *(ma_uint16 *)(local_10 + 6) = mVar1;
    mVar1 = ma_dr_wav_bytes_to_u16(amStack_26);
    *(ma_uint16 *)((long)local_10 + 0x1a) = mVar1;
    uVar3 = local_18 - 0x14;
    if (uVar3 == 0) {
      local_10[7] = 0;
      *(undefined8 *)(local_10 + 8) = 0;
    }
    else {
      local_10[7] = local_18 + -0x15;
      pmVar4 = ma_dr_wav__metadata_get_memory(local_8,(ulong)uVar3,1);
      *(ma_uint8 **)(local_10 + 8) = pmVar4;
      ma_dr_wav__metadata_parser_read
                (pParser_00,(void *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8,(ma_uint64 *)0x217cf6);
    }
  }
  return 0;
}

Assistant:

MA_PRIVATE ma_uint64 ma_dr_wav__read_list_labelled_cue_region_to_metadata_obj(ma_dr_wav__metadata_parser* pParser, ma_dr_wav_metadata* pMetadata, ma_uint64 chunkSize)
{
    ma_uint8 buffer[MA_DR_WAV_LIST_LABELLED_TEXT_BYTES];
    ma_uint64 totalBytesRead = 0;
    size_t bytesJustRead = ma_dr_wav__metadata_parser_read(pParser, buffer, sizeof(buffer), &totalBytesRead);
    MA_DR_WAV_ASSERT(pParser->stage == ma_dr_wav__metadata_parser_stage_read);
    if (bytesJustRead == sizeof(buffer)) {
        ma_uint32 sizeIncludingNullTerminator;
        pMetadata->type                                = ma_dr_wav_metadata_type_list_labelled_cue_region;
        pMetadata->data.labelledCueRegion.cuePointId   = ma_dr_wav_bytes_to_u32(buffer + 0);
        pMetadata->data.labelledCueRegion.sampleLength = ma_dr_wav_bytes_to_u32(buffer + 4);
        pMetadata->data.labelledCueRegion.purposeId[0] = buffer[8];
        pMetadata->data.labelledCueRegion.purposeId[1] = buffer[9];
        pMetadata->data.labelledCueRegion.purposeId[2] = buffer[10];
        pMetadata->data.labelledCueRegion.purposeId[3] = buffer[11];
        pMetadata->data.labelledCueRegion.country      = ma_dr_wav_bytes_to_u16(buffer + 12);
        pMetadata->data.labelledCueRegion.language     = ma_dr_wav_bytes_to_u16(buffer + 14);
        pMetadata->data.labelledCueRegion.dialect      = ma_dr_wav_bytes_to_u16(buffer + 16);
        pMetadata->data.labelledCueRegion.codePage     = ma_dr_wav_bytes_to_u16(buffer + 18);
        sizeIncludingNullTerminator = (ma_uint32)chunkSize - MA_DR_WAV_LIST_LABELLED_TEXT_BYTES;
        if (sizeIncludingNullTerminator > 0) {
            pMetadata->data.labelledCueRegion.stringLength = sizeIncludingNullTerminator - 1;
            pMetadata->data.labelledCueRegion.pString      = (char*)ma_dr_wav__metadata_get_memory(pParser, sizeIncludingNullTerminator, 1);
            MA_DR_WAV_ASSERT(pMetadata->data.labelledCueRegion.pString != NULL);
            ma_dr_wav__metadata_parser_read(pParser, pMetadata->data.labelledCueRegion.pString, sizeIncludingNullTerminator, &totalBytesRead);
        } else {
            pMetadata->data.labelledCueRegion.stringLength = 0;
            pMetadata->data.labelledCueRegion.pString      = NULL;
        }
    }
    return totalBytesRead;
}